

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

void DoDamage(AActor *dmgtarget,AActor *inflictor,AActor *source,int amount,FName *DamageType,
             int flags,PClassActor *filter,FName *species)

{
  uint flags_00;
  int damage;
  AActor *pAVar1;
  AActor *inflictor_00;
  AActor *target;
  TAngle<double> local_50;
  FName local_44;
  uint local_40;
  FName local_3c;
  int dmgFlags;
  uint local_34;
  bool speciespass;
  bool filterpass;
  FName *pFStack_30;
  int flags_local;
  FName *DamageType_local;
  AActor *pAStack_20;
  int amount_local;
  AActor *source_local;
  AActor *inflictor_local;
  AActor *dmgtarget_local;
  
  local_34 = flags;
  pFStack_30 = DamageType;
  DamageType_local._4_4_ = amount;
  pAStack_20 = source;
  source_local = inflictor;
  inflictor_local = dmgtarget;
  dmgFlags._3_1_ = DoCheckClass(dmgtarget,filter,(flags & 0x40U) != 0);
  pAVar1 = inflictor_local;
  FName::FName(&local_3c,species);
  dmgFlags._2_1_ = DoCheckSpecies(pAVar1,&local_3c,(local_34 & 0x80) != 0);
  if ((local_34 & 0x100) == 0) {
    if ((dmgFlags._3_1_ & 1) == 0) {
      return;
    }
  }
  else if ((dmgFlags._3_1_ & 1) != 0) goto LAB_0052ecdb;
  if (!(bool)dmgFlags._2_1_) {
    return;
  }
LAB_0052ecdb:
  local_40 = 0;
  if ((local_34 & 1) != 0) {
    local_40 = 0x40;
  }
  if ((local_34 & 0x10) != 0) {
    local_40 = local_40 | 0x80;
  }
  if ((local_34 & 0xc) != 0) {
    local_40 = local_40 | 0x10;
  }
  if (((local_34 & 2) == 0) || ((local_34 & 4) != 0)) {
    local_40 = local_40 | 1;
  }
  if ((local_34 & 4) != 0) {
    DamageType_local._4_4_ = inflictor_local->health + DamageType_local._4_4_;
  }
  if ((local_34 & 0x20) != 0) {
    local_40 = local_40 | 0x100;
  }
  if (DamageType_local._4_4_ < 1) {
    if (DamageType_local._4_4_ < 0) {
      DamageType_local._4_4_ = -DamageType_local._4_4_;
      P_GiveBody(inflictor_local,DamageType_local._4_4_,0);
    }
  }
  else {
    if ((local_34 & 0x200) != 0) {
      FName::operator=(DamageType,&(source_local->DamageType).super_FName);
    }
    target = inflictor_local;
    inflictor_00 = source_local;
    pAVar1 = pAStack_20;
    damage = DamageType_local._4_4_;
    FName::FName(&local_44,DamageType);
    flags_00 = local_40;
    TAngle<double>::TAngle(&local_50,0.0);
    P_DamageMobj(target,inflictor_00,pAVar1,damage,&local_44,flags_00,&local_50);
  }
  return;
}

Assistant:

static void DoDamage(AActor *dmgtarget, AActor *inflictor, AActor *source, int amount, FName DamageType, int flags, PClassActor *filter, FName species)
{
	bool filterpass = DoCheckClass(dmgtarget, filter, !!(flags & DMSS_EXFILTER)),
		speciespass = DoCheckSpecies(dmgtarget, species, !!(flags & DMSS_EXSPECIES));
	if ((flags & DMSS_EITHER) ? (filterpass || speciespass) : (filterpass && speciespass))
	{
		int dmgFlags = 0;
		if (flags & DMSS_FOILINVUL)
			dmgFlags |= DMG_FOILINVUL;
		if (flags & DMSS_FOILBUDDHA)
			dmgFlags |= DMG_FOILBUDDHA;
		if (flags & (DMSS_KILL | DMSS_NOFACTOR)) //Kill implies NoFactor
			dmgFlags |= DMG_NO_FACTOR;
		if (!(flags & DMSS_AFFECTARMOR) || (flags & DMSS_KILL)) //Kill overrides AffectArmor
			dmgFlags |= DMG_NO_ARMOR;
		if (flags & DMSS_KILL) //Kill adds the value of the damage done to it. Allows for more controlled extreme death types.
			amount += dmgtarget->health;
		if (flags & DMSS_NOPROTECT) //Ignore PowerProtection.
			dmgFlags |= DMG_NO_PROTECT;
	
		if (amount > 0)
		{ //Should wind up passing them through just fine.
			if (flags & DMSS_INFLICTORDMGTYPE)
				DamageType = inflictor->DamageType;

			P_DamageMobj(dmgtarget, inflictor, source, amount, DamageType, dmgFlags);
		}
		else if (amount < 0)
		{
			amount = -amount;
			P_GiveBody(dmgtarget, amount);
		}
	}
}